

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EDCircles.cpp
# Opt level: O2

void __thiscall EDCircles::ValidateCircles(EDCircles *this)

{
  uint uVar1;
  EllipseEquation *eq_00;
  double dVar2;
  double dVar3;
  Circle *pCVar4;
  uchar *puVar5;
  bool bVar6;
  double *px;
  double *py;
  NFALUT *pNVar7;
  ulong extraout_RAX;
  ulong extraout_RAX_00;
  ulong uVar8;
  long lVar9;
  uint uVar10;
  int iVar11;
  long lVar12;
  uint uVar13;
  int iVar14;
  ulong uVar15;
  int iVar16;
  long lVar17;
  int iVar18;
  EDCircles *pEVar19;
  ulong uVar20;
  uint uVar21;
  int iVar22;
  long lVar23;
  double dVar24;
  double dVar25;
  double dVar26;
  undefined1 auVar27 [16];
  int iVar29;
  undefined1 auVar28 [16];
  undefined1 auVar30 [16];
  int noPoints;
  ulong local_b8;
  int local_ac;
  double local_a8;
  double local_a0;
  int local_94;
  EllipseEquation *local_90;
  double local_88;
  undefined1 local_78 [16];
  EllipseEquation eq;
  
  iVar22 = (this->super_EDPF).super_ED.width;
  iVar16 = (this->super_EDPF).super_ED.height;
  iVar14 = iVar16 + iVar22;
  local_94 = iVar14 * 8;
  uVar8 = 0xffffffffffffffff;
  if (-1 < iVar14) {
    uVar8 = (long)local_94 << 3;
  }
  px = (double *)operator_new__(uVar8);
  py = (double *)operator_new__(uVar8);
  dVar24 = log10((double)(iVar16 * iVar22));
  dVar25 = log10((double)((this->super_EDPF).super_ED.height + (this->super_EDPF).super_ED.width));
  iVar14 = (this->super_EDPF).super_ED.height;
  iVar22 = (this->super_EDPF).super_ED.width;
  pNVar7 = (NFALUT *)operator_new(0x20);
  NFALUT::NFALUT(pNVar7,(iVar14 + iVar22) / 8,0.125,dVar24 + dVar24 + dVar25);
  this->nfa = pNVar7;
  iVar22 = 0;
  iVar14 = 0;
LAB_0010cb84:
  while( true ) {
    iVar16 = (this->super_EDPF).super_ED.width;
    iVar29 = (this->super_EDPF).super_ED.height;
    if (iVar29 < iVar16) {
      iVar29 = iVar16;
    }
    pCVar4 = this->circles1;
    lVar23 = (long)iVar22 * 0x98 + 0x40;
    while( true ) {
      if (this->noCircles1 <= iVar22) {
        this->noCircles2 = iVar14;
        operator_delete__(px);
        operator_delete__(py);
        pNVar7 = this->nfa;
        if (pNVar7 != (NFALUT *)0x0) {
          NFALUT::~NFALUT(pNVar7);
        }
        operator_delete(pNVar7);
        return;
      }
      dVar24 = *(double *)((long)(&pCVar4->eq + -2) + lVar23);
      if (dVar24 <= (double)iVar29) break;
      iVar22 = iVar22 + 1;
      lVar23 = lVar23 + 0x98;
    }
    eq_00 = (EllipseEquation *)((long)(pCVar4->eq).coeff + lVar23 + -0x40);
    local_a0 = *(double *)((long)(pCVar4->eq).coeff + lVar23 + -0x80);
    local_a8 = *(double *)((long)(pCVar4->eq).coeff + lVar23 + -0x78);
    dVar25 = computeEllipsePerimeter(eq_00);
    uVar10 = (uint)dVar25;
    noPoints = uVar10;
    if ((int)uVar10 <= local_94) break;
LAB_0010cc17:
    iVar22 = iVar22 + 1;
  }
  local_90 = eq_00;
  if (*(char *)((long)(pCVar4->eq).coeff + lVar23) == '\x01') {
    if ((uVar10 & 1) != 0) {
      uVar10 = uVar10 - 1;
    }
    noPoints = uVar10;
    ComputeEllipsePoints((double *)eq_00,px,py,uVar10);
    uVar8 = extraout_RAX;
  }
  else {
    ComputeCirclePoints(local_a0,local_a8,dVar24,px,py,&noPoints);
    uVar8 = extraout_RAX_00;
    uVar10 = noPoints;
  }
  uVar15 = 0;
  uVar20 = (ulong)uVar10;
  if ((int)uVar10 < 1) {
    uVar20 = uVar15;
  }
  auVar27._8_4_ = 0xffffffff;
  auVar27._0_8_ = 0xffffffffffffffff;
  auVar27._12_4_ = 0xffffffff;
  local_ac = 0;
  iVar16 = 0;
  local_b8 = uVar20;
  for (; uVar20 != uVar15; uVar15 = uVar15 + 1) {
    auVar30._0_4_ = (uint)(px[uVar15] + 0.5);
    auVar30._4_4_ = (uint)(py[uVar15] + 0.5);
    auVar30._8_8_ = 0;
    auVar28._0_4_ = -(uint)(auVar27._0_4_ == auVar30._0_4_);
    iVar29 = -(uint)(auVar27._4_4_ == auVar30._4_4_);
    auVar28._4_4_ = auVar28._0_4_;
    auVar28._8_4_ = iVar29;
    auVar28._12_4_ = iVar29;
    uVar10 = movmskpd((int)uVar8,auVar28);
    uVar8 = (ulong)uVar10;
    if ((uVar10 != 3) && (iVar16 = iVar16 + 1, 0 < (int)auVar30._4_4_)) {
      iVar29 = (this->super_EDPF).super_ED.height;
      uVar1 = iVar29 - 1;
      uVar8 = (ulong)CONCAT31((int3)(uVar10 >> 8),(int)uVar1 <= (int)auVar30._4_4_);
      if (0 < (int)auVar30._0_4_ && (int)auVar30._4_4_ < (int)uVar1) {
        uVar10 = (this->super_EDPF).super_ED.width;
        uVar8 = (ulong)uVar10;
        if ((int)auVar30._0_4_ < (int)(uVar10 - 1)) {
          puVar5 = (this->super_EDPF).super_ED.edgeImg;
          iVar18 = uVar10 * auVar30._4_4_;
          lVar12 = (long)(int)(iVar18 + auVar30._0_4_);
          uVar21 = auVar30._4_4_;
          uVar13 = auVar30._0_4_;
          if (puVar5[lVar12] == 0xff) goto LAB_0010ceb7;
          iVar11 = (int)((((double)(int)auVar30._4_4_ - local_a8) + (double)(int)auVar30._0_4_) -
                        local_a0);
          uVar20 = local_b8;
          auVar27 = auVar30;
          if ((int)((((double)(int)auVar30._4_4_ - local_a8) - (double)(int)auVar30._0_4_) +
                   local_a0) < 0) {
            if (iVar11 < 1) goto LAB_0010cd9a;
LAB_0010ce33:
            if ((auVar30._0_4_ != 1) &&
               (lVar12 = (long)(int)(iVar18 + auVar30._0_4_ + -1), puVar5[lVar12] == 0xff)) {
              uVar13 = auVar30._0_4_ - 1;
              goto LAB_0010ceb7;
            }
            uVar13 = auVar30._0_4_ + 1;
            if ((uVar13 < uVar10 - 1) &&
               (lVar12 = (long)(int)(iVar18 + uVar13), puVar5[lVar12] == 0xff)) goto LAB_0010ceb7;
            if ((3 < auVar30._0_4_) &&
               (lVar12 = (long)(int)(iVar18 + auVar30._0_4_ + -2), puVar5[lVar12] == 0xff)) {
              uVar13 = auVar30._0_4_ - 2;
              goto LAB_0010ceb7;
            }
            uVar13 = auVar30._0_4_ + 2;
            if (uVar10 - 2 <= uVar13) goto LAB_0010cd18;
            iVar18 = iVar18 + uVar13;
LAB_0010ce8b:
            lVar12 = (long)iVar18;
            if (puVar5[lVar12] != 0xff) goto LAB_0010cd18;
          }
          else {
            if (iVar11 < 1) goto LAB_0010ce33;
LAB_0010cd9a:
            if (auVar30._4_4_ == 1) {
LAB_0010cdbe:
              uVar21 = auVar30._4_4_ + 1;
              if ((uVar1 <= uVar21) ||
                 (lVar12 = (long)(int)(uVar10 * uVar21 + auVar30._0_4_), puVar5[lVar12] != 0xff)) {
                if (3 < auVar30._4_4_) {
                  lVar12 = (long)(int)(uVar10 * (auVar30._4_4_ - 2) + auVar30._0_4_);
                  uVar21 = auVar30._4_4_ - 2;
                  if (puVar5[lVar12] == 0xff) goto LAB_0010ceb7;
                }
                uVar21 = auVar30._4_4_ + 2;
                if (iVar29 - 2U <= uVar21) goto LAB_0010cd18;
                iVar18 = uVar10 * uVar21 + auVar30._0_4_;
                goto LAB_0010ce8b;
              }
            }
            else {
              uVar21 = auVar30._4_4_ - 1;
              lVar12 = (long)(int)(uVar10 * uVar21 + auVar30._0_4_);
              if (puVar5[lVar12] != 0xff) goto LAB_0010cdbe;
            }
          }
LAB_0010ceb7:
          puVar5 = (this->super_EDPF).super_ED.smoothImg;
          lVar17 = (long)(int)((uVar21 + 1) * uVar10 + uVar13);
          lVar9 = (long)(int)((uVar21 - 1) * uVar10 + uVar13);
          local_78 = auVar30;
          local_88 = NFALUT::myAtan2((double)(int)(((uint)puVar5[lVar12 + 1] +
                                                    ((uint)puVar5[lVar9 + 1] -
                                                    (uint)puVar5[lVar17 + -1]) +
                                                   ((uint)puVar5[lVar17 + 1] -
                                                   (uint)puVar5[lVar9 + -1])) -
                                                  (uint)puVar5[lVar12 + -1]),
                                     (double)(int)((((uint)puVar5[lVar9 + 1] -
                                                    (uint)puVar5[lVar17 + -1]) -
                                                   ((uint)puVar5[lVar17] +
                                                   ((uint)puVar5[lVar17 + 1] -
                                                   (uint)puVar5[lVar9 + -1]))) + (uint)puVar5[lVar9]
                                                  ));
          dVar25 = (double)(int)uVar13;
          dVar24 = (double)(int)uVar21;
          if (*(char *)((long)(pCVar4->eq).coeff + lVar23) == '\x01') {
            dVar26 = *(double *)((long)(&pCVar4->eq + -1) + lVar23);
            dVar2 = *(double *)((long)(pCVar4->eq).coeff + lVar23 + -0x30);
            dVar26 = (dVar26 + dVar26) * dVar25 + dVar2 * dVar24 +
                     *(double *)((long)(pCVar4->eq).coeff + lVar23 + -0x20);
            dVar3 = *(double *)((long)(pCVar4->eq).coeff + lVar23 + -0x28);
            dVar24 = dVar2 * dVar25 + (dVar3 + dVar3) * dVar24 +
                     *(double *)((long)(pCVar4->eq).coeff + lVar23 + -0x18);
          }
          else {
            dVar26 = dVar25 - local_a0;
            dVar24 = dVar24 - local_a8;
          }
          dVar24 = NFALUT::myAtan2(dVar26,-dVar24);
          uVar20 = -(ulong)(ABS(local_88 - dVar24) <= 0.19634954084936207 ||
                           2.945243112740431 <= ABS(local_88 - dVar24));
          uVar8 = uVar20 & 0xffffffff;
          local_ac = local_ac - (int)uVar20;
          uVar20 = local_b8;
          auVar27 = local_78;
        }
      }
    }
LAB_0010cd18:
  }
  if (*(char *)((long)(pCVar4->eq).coeff + lVar23) != '\0') {
    computeEllipsePerimeter(local_90);
  }
  pEVar19 = this;
  bVar6 = NFALUT::checkValidationByNFA(this->nfa,iVar16,local_ac);
  iVar16 = (int)pEVar19;
  if (bVar6) {
    lVar12 = (long)iVar14;
    iVar14 = iVar14 + 1;
    memcpy(this->circles2 + lVar12,(void *)((long)(this->circles1->eq).coeff + lVar23 + -0x80),0x98)
    ;
  }
  else if ((*(char *)((long)(pCVar4->eq).coeff + lVar23) == '\0') &&
          (0.5 <= *(double *)((long)(pCVar4->eq).coeff + lVar23 + -0x60))) {
    EllipseEquation::EllipseEquation(&eq);
    bVar6 = EllipseFit(*(EDCircles **)((long)(pCVar4->eq).coeff + lVar23 + -0x58),
                       *(double **)((long)(pCVar4->eq).coeff + lVar23 + -0x50),
                       (double *)(ulong)*(uint *)((long)(pCVar4->eq).coeff + lVar23 + -0x48),
                       (int)&eq,(EllipseEquation *)0x1,iVar16);
    if ((!bVar6) ||
       (dVar24 = ComputeEllipseError(&eq,*(double **)((long)(pCVar4->eq).coeff + lVar23 + -0x58),
                                     *(double **)((long)(pCVar4->eq).coeff + lVar23 + -0x50),
                                     *(int *)((long)(pCVar4->eq).coeff + lVar23 + -0x48)),
       1.5 < dVar24)) goto LAB_0010cc17;
    *(undefined1 *)((long)(pCVar4->eq).coeff + lVar23) = 1;
    *(double *)((long)(pCVar4->eq).coeff + lVar23 + -8) = dVar24;
    local_90->coeff[6] = eq.coeff[6];
    local_90->coeff[4] = eq.coeff[4];
    local_90->coeff[5] = eq.coeff[5];
    local_90->coeff[2] = eq.coeff[2];
    local_90->coeff[3] = eq.coeff[3];
    local_90->coeff[0] = eq.coeff[0];
    local_90->coeff[1] = eq.coeff[1];
    goto LAB_0010cb84;
  }
  iVar22 = iVar22 + 1;
  goto LAB_0010cb84;
}

Assistant:

void EDCircles::ValidateCircles()
{
	double prec = PI / 16;  // Alignment precision
	double prob = 1.0 / 8;  // probability of alignment

	int points_buffer_size = 8 * (width + height);
	double *px = new double[points_buffer_size];
	double *py = new double[points_buffer_size];

	// logNT & LUT for NFA computation
	double logNT = 2 * log10((double)(width*height)) + log10((double)(width + height));

	int lutSize = (width + height) / 8;
	nfa = new NFALUT(lutSize, prob, logNT); // create look up table

	// Validate circles & ellipses
	bool validateAgain;
	int count = 0;
	for (int i = 0; i<noCircles1; ) {
		Circle *circle = &circles1[i];
		double xc = circle->xc;
		double yc = circle->yc;
		double radius = circle->r;

		// Skip potential invalid circles (sometimes these kinds of candidates get generated!)
		if (radius > MAX(width, height)) { i++; continue; }

		validateAgain = false;

		int noPoints = (int)(computeEllipsePerimeter(&circle->eq));

		if (noPoints > points_buffer_size)
		{
			i++;
			continue;
		}

		if (circle->isEllipse) {
			if (noPoints % 2) noPoints--;
			ComputeEllipsePoints(circle->eq.coeff, px, py, noPoints);

		}
		else {
			ComputeCirclePoints(xc, yc, radius, px, py, &noPoints);
		} //end-else

		int pr = -1;  // previous row
		int pc = -1;  // previous column

		int tr = -100;
		int tc = -100;
		int tcount = 0;

		int noPeripheryPixels = 0;
		int noEdgePixels = 0;
		int aligned = 0;
		for (int j = 0; j<noPoints; j++) {
			int r = (int)(py[j] + 0.5);
			int c = (int)(px[j] + 0.5);

			if (r == pr && c == pc) continue;
			noPeripheryPixels++;

			if (r <= 0 || r >= height - 1) continue;
			if (c <= 0 || c >= width - 1) continue;

			pr = r;
			pc = c;

			int dr = abs(r - tr);
			int dc = abs(c - tc);
			if (dr + dc >= 2) {
				tr = r;
				tc = c;
				tcount++;
			} //end-if

#if 1
			  //
			  // See if there is an edge pixel within 1 pixel vicinity
			  //
			if (edgeImg[r*width + c] != 255) {
				//   y-cy=-x-cx    y-cy=x-cx
				//         \       /
				//          \ IV. /
				//           \   / 
				//            \ / 
				//     III.    +   I. quadrant
				//            / \
				//           /   \ 
				//          / II. \
				//         /       \
				//
				// (x, y)-->(x-cx, y-cy)
				//
				
				int x = c;
				int y = r;

				int diff1 = (int)(y - yc - x + xc);
				int diff2 = (int)(y - yc + x - xc);

				if (diff1 < 0) {
					if (diff2 > 0) {
						// I. quadrant
						c = x - 1;
						if (c >= 1 && edgeImg[r*width + c] == 255) goto out;
						c = x + 1;
						if (c<width - 1 && edgeImg[r*width + c] == 255) goto out;

#if 1
						c = x - 2;
						if (c >= 2 && edgeImg[r*width + c] == 255) goto out;
						c = x + 2;
						if (c<width - 2 && edgeImg[r*width + c] == 255) goto out;
#endif
					}
					else {
						// IV. quadrant
						r = y - 1;
						if (r >= 1 && edgeImg[r*width + c] == 255) goto out;
						r = y + 1;
						if (r<height - 1 && edgeImg[r*width + c] == 255) goto out;

#if 1
						r = y - 2;
						if (r >= 2 && edgeImg[r*width + c] == 255) goto out;
						r = y + 2;
						if (r<height - 2 && edgeImg[r*width + c] == 255) goto out;
#endif
					} //end-else

				}
				else {
					if (diff2 > 0) {
						// II. quadrant
						r = y - 1;
						if (r >= 1 && edgeImg[r*width + c] == 255) goto out;
						r = y + 1;
						if (r<height - 1 && edgeImg[r*width + c] == 255) goto out;

#if 1
						r = y - 2;
						if (r >= 2 && edgeImg[r*width + c] == 255) goto out;
						r = y + 2;
						if (r<height - 2 && edgeImg[r*width + c] == 255) goto out;
#endif
					}
					else {
						// III. quadrant
						c = x - 1;
						if (c >= 1 && edgeImg[r*width + c] == 255) goto out;
						c = x + 1;
						if (c<width - 1 && edgeImg[r*width + c] == 255) goto out;

#if 1
						c = x - 2;
						if (c >= 2 && edgeImg[r*width + c] == 255) goto out;
						c = x + 2;
						if (c<width - 2 && edgeImg[r*width + c] == 255) goto out;
#endif
					} //end-else
				} //end-else

				r = pr;
				c = pc;
				continue;  // Ignore non-edge pixels. 
						   // This produces less false positives, but occationally misses on some valid circles
			} //end-if
		out:
			if (edgeImg[r*width + c] == 255) noEdgePixels++;
			//      map->edgeImg[r*width+c] = 254;
#endif

			// compute gx & gy
			int com1 = smoothImg[(r + 1)*width + c + 1] - smoothImg[(r - 1)*width + c - 1];
			int com2 = smoothImg[(r - 1)*width + c + 1] - smoothImg[(r + 1)*width + c - 1];

			int gx = com1 + com2 + smoothImg[r*width + c + 1] - smoothImg[r*width + c - 1];
			int gy = com1 - com2 + smoothImg[(r + 1)*width + c] - smoothImg[(r - 1)*width + c];
			double pixelAngle = nfa->myAtan2((double)gx, (double)-gy);

			double derivX, derivY;
			if (circle->isEllipse) {
				// Ellipse
				derivX = 2 * circle->eq.A()*c + circle->eq.B()*r + circle->eq.D();
				derivY = circle->eq.B()*c + 2 * circle->eq.C()*r + circle->eq.E();

			}
			else {
				// circle
				derivX = c - xc;
				derivY = r - yc;
			} //end-else

			double idealPixelAngle = nfa->myAtan2(derivX, -derivY);
			double diff = fabs(pixelAngle - idealPixelAngle);
			if (diff <= prec || diff >= PI - prec) aligned++;
		} //end-for

		double circumference;
		if (circle->isEllipse) circumference = computeEllipsePerimeter(&circle->eq);
		else                   circumference = TWOPI*radius;

		// Validate by NFA
		bool isValid = nfa->checkValidationByNFA(noPeripheryPixels, aligned);

		if (isValid) {
			circles2[count++] = circles1[i];

		}
		else if (circle->isEllipse == false && circle->coverRatio >= CANDIDATE_ELLIPSE_RATIO) {
			// Fit an ellipse to this circle, and try to revalidate
			double ellipseFitError = 1e10;
			EllipseEquation eq;

			if (EllipseFit(circle->x, circle->y, circle->noPixels, &eq)) {
				ellipseFitError = ComputeEllipseError(&eq, circle->x, circle->y, circle->noPixels);
			} //end-if

			if (ellipseFitError <= ELLIPSE_ERROR) {
				circle->isEllipse = true;
				circle->ellipseFitError = ellipseFitError;
				circle->eq = eq;

				validateAgain = true;
			} //end-if
		} //end-else

		if (validateAgain == false) i++;
	} //end-for

	noCircles2 = count;

	delete[] px;
	delete[] py;
	delete nfa;
}